

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pcVar3;
  pointer piVar4;
  pointer pcVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  _Rb_tree_header *p_Var10;
  cmGraphEdge *ni;
  pointer pcVar11;
  pointer piVar12;
  ulong uVar13;
  int head;
  ulong local_d0;
  cmComputeComponentGraph *local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  
  this_00 = &this->FinalGraph;
  uVar13 = 0;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->InitialGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  local_c0 = &ccg->TarjanComponents;
  local_b8 = &this->ComponentHead;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b8,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(ccg->Components).
                            super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ComponentTail,
             ((long)(ccg->Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(ccg->Components).
                   super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  uVar9 = ((long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  iVar8 = (int)uVar9;
  local_d0 = 0;
  if (0 < iVar8) {
    local_d0 = uVar9 & 0xffffffff;
  }
  p_Var1 = &visited._M_t._M_impl.super__Rb_tree_header;
  local_c8 = ccg;
  do {
    p_Var10 = &emitted._M_t._M_impl.super__Rb_tree_header;
    if (uVar13 == local_d0) {
      uVar9 = ((long)(local_c8->ComponentGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_c8->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18;
      local_c0 = (vector<int,_std::allocator<int>_> *)0x0;
      local_d0 = uVar9 & 0xffffffff;
      if ((int)uVar9 < 1) {
        local_d0 = (ulong)local_c0;
      }
      for (; local_c0 != (vector<int,_std::allocator<int>_> *)local_d0;
          local_c0 = (vector<int,_std::allocator<int>_> *)((long)local_c0 + 1)) {
        iVar2 = (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)local_c0];
        pcVar5 = (local_c8->ComponentGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar6 = *(pointer *)
                  ((long)&pcVar5[(long)local_c0].
                          super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                          super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        for (pcVar11 = *(pointer *)
                        &pcVar5[(long)local_c0].
                         super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                         super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
            pcVar11 != pcVar6; pcVar11 = pcVar11 + 1) {
          emitted._M_t._M_impl._0_4_ =
               (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar11->Dest];
          visited._M_t._M_impl._0_1_ = pcVar11->Strong;
          head = CONCAT31(head._1_3_,pcVar11->Cross);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar2),(int *)&emitted,(bool *)&visited,
                     (bool *)&head,&pcVar11->Backtrace);
        }
      }
LAB_003844b2:
      return (long)iVar8 <= (long)uVar13;
    }
    head = -1;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar3 = (local_c8->Components).
             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = *(pointer *)
              &pcVar3[uVar13].super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl;
    piVar12 = *(pointer *)
               ((long)&pcVar3[uVar13].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
    for (; piVar12 != piVar4; piVar12 = piVar12 + -1) {
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      bVar7 = IntraComponent(this,local_c0,(int)uVar13,piVar12[-1],&head,&emitted,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&visited._M_t);
      if (!bVar7) {
        ComplainAboutBadComponent(this,local_c8,(int)uVar13,true);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&visited._M_t);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&emitted._M_t);
        goto LAB_003844b2;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&visited._M_t);
    }
    (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar13] = head;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&emitted._M_t);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (int ni : cmReverseRange(nl)) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      int dependee_component = ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.IsCross(),
        ni.GetBacktrace());
    }
  }
  return true;
}